

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

uint8 * google::protobuf::internal::WireFormatLite::WritePrimitiveNoTagToArray<long>
                  (RepeatedField<long> *value,_func_uint8_ptr_long_uint8_ptr *Writer,uint8 *target)

{
  LogMessage *other;
  long *plVar1;
  int local_84;
  int i;
  long *ii;
  byte local_61;
  LogMessage local_60;
  int local_24;
  uint8 *puStack_20;
  int n;
  uint8 *target_local;
  _func_uint8_ptr_long_uint8_ptr *Writer_local;
  RepeatedField<long> *value_local;
  
  puStack_20 = target;
  target_local = (uint8 *)Writer;
  Writer_local = (_func_uint8_ptr_long_uint8_ptr *)value;
  local_24 = RepeatedField<long>::size(value);
  local_61 = 0;
  if (local_24 < 1) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite_inl.h"
               ,0x2a4);
    local_61 = 1;
    other = LogMessage::operator<<(&local_60,"CHECK failed: (n) > (0): ");
    LogFinisher::operator=((LogFinisher *)((long)&ii + 3),other);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  plVar1 = RepeatedField<long>::unsafe_data((RepeatedField<long> *)Writer_local);
  local_84 = 0;
  do {
    puStack_20 = (uint8 *)(*(code *)target_local)(plVar1[local_84],puStack_20);
    local_84 = local_84 + 1;
  } while (local_84 < local_24);
  return puStack_20;
}

Assistant:

inline uint8* WireFormatLite::WritePrimitiveNoTagToArray(
      const RepeatedField<T>& value,
      uint8* (*Writer)(T, uint8*), uint8* target) {
  const int n = value.size();
  GOOGLE_DCHECK_GT(n, 0);

  const T* ii = value.unsafe_data();
  int i = 0;
  do {
    target = Writer(ii[i], target);
  } while (++i < n);

  return target;
}